

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int cbs_get_length_prefixed(CBS *cbs,CBS *out,size_t len_len)

{
  int iVar1;
  size_t local_30;
  uint64_t len;
  size_t len_len_local;
  CBS *out_local;
  CBS *cbs_local;
  
  len = len_len;
  len_len_local = (size_t)out;
  out_local = cbs;
  iVar1 = cbs_get_u(cbs,&local_30,len_len);
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    if (3 < len) {
      __assert_fail("len_len <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0xbf,"int cbs_get_length_prefixed(CBS *, CBS *, size_t)");
    }
    cbs_local._4_4_ = CBS_get_bytes(out_local,(CBS *)len_len_local,local_30);
  }
  return cbs_local._4_4_;
}

Assistant:

static int cbs_get_length_prefixed(CBS *cbs, CBS *out, size_t len_len) {
  uint64_t len;
  if (!cbs_get_u(cbs, &len, len_len)) {
    return 0;
  }
  // If |len_len| <= 3 then we know that |len| will fit into a |size_t|, even on
  // 32-bit systems.
  assert(len_len <= 3);
  return CBS_get_bytes(cbs, out, len);
}